

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

DragDropMode __thiscall QAbstractItemView::dragDropMode(QAbstractItemView *this)

{
  bool bVar1;
  QAbstractItemViewPrivate *pQVar2;
  DragDropMode setBehavior;
  QAbstractItemViewPrivate *d;
  undefined4 in_stack_ffffffffffffffe0;
  DragDropMode DVar3;
  DragDropMode local_4;
  
  pQVar2 = d_func((QAbstractItemView *)0x80333b);
  DVar3 = pQVar2->dragDropMode;
  bVar1 = dragEnabled((QAbstractItemView *)CONCAT44(DVar3,in_stack_ffffffffffffffe0));
  if ((bVar1) || (bVar1 = QWidget::acceptDrops((QWidget *)0x803365), bVar1)) {
    bVar1 = dragEnabled((QAbstractItemView *)CONCAT44(DVar3,in_stack_ffffffffffffffe0));
    if ((!bVar1) || (bVar1 = QWidget::acceptDrops((QWidget *)0x80338e), bVar1)) {
      bVar1 = dragEnabled((QAbstractItemView *)CONCAT44(DVar3,in_stack_ffffffffffffffe0));
      if ((bVar1) || (bVar1 = QWidget::acceptDrops((QWidget *)0x8033b2), !bVar1)) {
        bVar1 = dragEnabled((QAbstractItemView *)CONCAT44(DVar3,in_stack_ffffffffffffffe0));
        if ((bVar1) && (bVar1 = QWidget::acceptDrops((QWidget *)0x8033da), bVar1)) {
          if (DVar3 == InternalMove) {
            local_4 = InternalMove;
          }
          else {
            local_4 = DragDrop;
          }
        }
        else {
          local_4 = NoDragDrop;
        }
      }
      else {
        local_4 = DropOnly;
      }
    }
    else {
      local_4 = DragOnly;
    }
  }
  else {
    local_4 = NoDragDrop;
  }
  return local_4;
}

Assistant:

QAbstractItemView::DragDropMode QAbstractItemView::dragDropMode() const
{
    Q_D(const QAbstractItemView);
    DragDropMode setBehavior = d->dragDropMode;
    if (!dragEnabled() && !acceptDrops())
        return NoDragDrop;

    if (dragEnabled() && !acceptDrops())
        return DragOnly;

    if (!dragEnabled() && acceptDrops())
        return DropOnly;

    if (dragEnabled() && acceptDrops()) {
        if (setBehavior == InternalMove)
            return setBehavior;
        else
            return DragDrop;
    }

    return NoDragDrop;
}